

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O2

WaiterList * __thiscall Js::SharedArrayBuffer::GetWaiterList(SharedArrayBuffer *this,uint index)

{
  Type pSVar1;
  code *pcVar2;
  bool bVar3;
  HeapAllocator *pHVar4;
  IndexToWaitersMap *pIVar5;
  WaiterList *this_00;
  undefined4 *puVar6;
  AutoCriticalSection AVar7;
  undefined1 local_60 [8];
  TrackAllocData data;
  AutoCriticalSection autoCS;
  WaiterList *waiters;
  uint index_local;
  
  waiters._4_4_ = index;
  if (this->sharedContents == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x17d,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    AVar7.cs = (CriticalSection *)0x0;
  }
  else {
    data._32_8_ = csSharedArrayBuffer;
    CCLock::Enter((CCLock *)csSharedArrayBuffer);
    pIVar5 = this->sharedContents->indexToWaiterList;
    if (pIVar5 == (IndexToWaitersMap *)0x0) {
      local_60 = (undefined1  [8])
                 &JsUtil::
                  BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_8c1ccee;
      data.filename._0_4_ = 0x171;
      pHVar4 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
      pIVar5 = (IndexToWaitersMap *)new<Memory::HeapAllocator>(0x38,pHVar4,0x2f6726);
      pIVar5->buckets = (Type)0x0;
      pIVar5->entries = (Type)0x0;
      pIVar5->alloc = &Memory::HeapAllocator::Instance;
      pIVar5->size = 0;
      pIVar5->bucketCount = 0;
      pIVar5->count = 0;
      pIVar5->freeCount = 0;
      pIVar5->modFunctionIndex = 0x4b;
      pIVar5->stats = (Type)0x0;
      pSVar1 = this->sharedContents;
      pSVar1->indexToWaiterList = pIVar5;
      pIVar5 = pSVar1->indexToWaiterList;
    }
    autoCS.cs = (CriticalSection *)0x0;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(pIVar5,(uint *)((long)&waiters + 4),(WaiterList **)&autoCS);
    if (!bVar3) {
      local_60 = (undefined1  [8])&WaiterList::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_8c1ccee;
      data.filename._0_4_ = 0x177;
      pHVar4 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
      this_00 = (WaiterList *)new<Memory::HeapAllocator>(0x48,pHVar4,0x2f6726);
      WaiterList::WaiterList(this_00);
      autoCS.cs = (CriticalSection *)this_00;
      JsUtil::
      BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->sharedContents->indexToWaiterList,(uint *)((long)&waiters + 4),
                 (WaiterList **)&autoCS);
    }
    AVar7.cs = autoCS.cs;
    AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&data.line);
  }
  return (WaiterList *)AVar7.cs;
}

Assistant:

WaiterList *SharedArrayBuffer::GetWaiterList(uint index)
    {
        if (sharedContents != nullptr)
        {
            // REVIEW: only lock creating the map and pass the lock to the map?
            //         use one lock per instance?
            AutoCriticalSection autoCS(&csSharedArrayBuffer);

            if (sharedContents->indexToWaiterList == nullptr)
            {
                sharedContents->indexToWaiterList = HeapNew(IndexToWaitersMap, &HeapAllocator::Instance);
            }

            WaiterList * waiters = nullptr;
            if (!sharedContents->indexToWaiterList->TryGetValue(index, &waiters))
            {
                waiters = HeapNew(WaiterList);
                sharedContents->indexToWaiterList->Add(index, waiters);
            }
            return waiters;
        }

        Assert(false);
        return nullptr;
    }